

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

int try_split_partition(AV1_COMP *cpi,ThreadData *td,TileDataEnc *tile_data,TileInfo *tile_info,
                       TokenExtra **tp,MACROBLOCK *x,MACROBLOCKD *xd,CommonModeInfoParams *mi_params
                       ,int mi_row,int mi_col,BLOCK_SIZE bsize,int pl,PC_TREE *pc_tree)

{
  byte bVar1;
  BLOCK_SIZE BVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  PICK_MODE_CONTEXT *pPVar8;
  PC_TREE *pPVar9;
  long in_RCX;
  long *in_RDI;
  long in_R9;
  long in_stack_00000008;
  long in_stack_00000010;
  uint in_stack_00000018;
  int in_stack_00000020;
  BLOCK_SIZE in_stack_00000028;
  int split;
  int y_idx;
  int x_idx;
  RD_STATS block_rdc;
  int i_1;
  int i;
  BLOCK_SIZE subsize;
  RD_STATS none_rdc;
  RD_STATS split_rdc;
  RD_SEARCH_MACROBLOCK_CONTEXT x_ctx;
  int threshold;
  int block_avg_sad;
  int blk_pix;
  uint plane_sad;
  BLOCK_SIZE bs;
  macroblockd_plane *pd;
  macroblock_plane *p;
  int plane;
  int block_sad;
  int num_planes;
  scale_factors *sf;
  YV12_BUFFER_CONFIG *yv12;
  int hbs;
  ModeCosts *mode_costs;
  AV1_COMMON *cm;
  uint uVar10;
  undefined4 in_stack_fffffffffffffd5c;
  undefined2 uVar11;
  AV1_COMMON *in_stack_fffffffffffffd60;
  MV_REFERENCE_FRAME in_stack_fffffffffffffd6f;
  AV1_COMMON *in_stack_fffffffffffffd70;
  undefined8 in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd80;
  int in_stack_fffffffffffffd84;
  int in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd8c;
  int in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffd94;
  int in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffd9c;
  MACROBLOCK *in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdac;
  int in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb4;
  undefined4 in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  uint uVar12;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  uint uVar13;
  int in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdcc;
  AV1_COMP *in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffde0;
  BLOCK_SIZE in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf4;
  PICK_MODE_CONTEXT *in_stack_fffffffffffffdf8;
  MACROBLOCK *in_stack_fffffffffffffe00;
  TileDataEnc *in_stack_fffffffffffffe08;
  AV1_COMP *in_stack_fffffffffffffe10;
  BLOCK_SIZE in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  PC_TREE_SHARED_BUFFERS *in_stack_ffffffffffffff28;
  BLOCK_SIZE in_stack_ffffffffffffff37;
  AV1_COMP *in_stack_ffffffffffffff38;
  int local_6c;
  int local_68;
  uint local_4;
  
  lVar5 = in_R9 + 0x4230;
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
          [in_stack_00000028];
  if (((int)(in_stack_00000018 +
            "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
            [in_stack_00000028]) < *(int *)(in_stack_00000010 + 0xc)) &&
     ((int)(in_stack_00000020 +
           (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                 [in_stack_00000028]) < *(int *)(in_stack_00000010 + 0x10))) {
    if ((in_stack_00000028 < BLOCK_8X16) ||
       (iVar3 = frame_is_intra_only((AV1_COMMON *)(in_RDI + 0x77f0)), iVar3 != 0)) {
      local_4 = 0;
    }
    else if (*(uint *)(in_R9 + 0x15d60) < 3) {
      local_4 = 0;
    }
    else {
      get_ref_frame_yv12_buf(in_stack_fffffffffffffd70,in_stack_fffffffffffffd6f);
      get_ref_scale_factors_const
                (in_stack_fffffffffffffd60,
                 (MV_REFERENCE_FRAME)((uint)in_stack_fffffffffffffd5c >> 0x18));
      iVar3 = av1_num_planes((AV1_COMMON *)(in_RDI + 0x77f0));
      av1_setup_src_planes
                ((MACROBLOCK *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                 (YV12_BUFFER_CONFIG *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,
                 in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,
                 (BLOCK_SIZE)((uint)in_stack_fffffffffffffd90 >> 0x18));
      av1_setup_pre_planes
                ((MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                 in_stack_fffffffffffffdbc,
                 (YV12_BUFFER_CONFIG *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0)
                 ,in_stack_fffffffffffffdac,in_stack_fffffffffffffda8,
                 (scale_factors *)in_stack_fffffffffffffda0,in_stack_fffffffffffffde0);
      local_68 = 0;
      for (local_6c = 0; local_6c < iVar3; local_6c = local_6c + 1) {
        lVar6 = in_R9 + (long)local_6c * 0x88;
        lVar7 = in_stack_00000008 + 0x10 + (long)local_6c * 0xa30;
        BVar2 = get_plane_block_size(in_stack_00000028,*(int *)(lVar7 + 4),*(int *)(lVar7 + 8));
        iVar4 = (**(code **)(*in_RDI + 0xc900 + (ulong)BVar2 * 0x70))
                          (*(undefined8 *)(lVar6 + 0x30),*(undefined4 *)(lVar6 + 0x48),
                           *(undefined8 *)(lVar7 + 0x30),*(undefined4 *)(lVar7 + 0x48));
        local_68 = iVar4 + local_68;
      }
      if (local_68 /
          (int)((uint)block_size_wide[in_stack_00000028] * (uint)block_size_high[in_stack_00000028])
          < 0x19) {
        local_4 = 0;
      }
      else {
        av1_invalid_rd_stats((RD_STATS *)&stack0xfffffffffffffdf0);
        av1_invalid_rd_stats((RD_STATS *)&stack0xfffffffffffffdc8);
        av1_save_context((MACROBLOCK *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90)
                         ,(RD_SEARCH_MACROBLOCK_CONTEXT *)
                          CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                         in_stack_fffffffffffffd84,in_stack_fffffffffffffd80,
                         (BLOCK_SIZE)((ulong)in_stack_fffffffffffffd78 >> 0x38),
                         (int)in_stack_fffffffffffffd78);
        *(long *)(in_stack_00000008 + 0x1fc0) =
             *(long *)(in_RDI[0x8453] + (long)*(int *)(in_RCX + 0x10) * 8) + (long)in_stack_00000020
        ;
        *(long *)(in_stack_00000008 + 0x1fc8) =
             in_stack_00000008 + 0x1fd0 + (long)(int)(in_stack_00000018 & 0x1f);
        *(undefined1 *)block_rdc._0_8_ = 0;
        av1_set_offsets((AV1_COMP *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                        (TileInfo *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                        in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,
                        in_stack_fffffffffffffd98,
                        (BLOCK_SIZE)((uint)in_stack_fffffffffffffd94 >> 0x18));
        if (*(long *)(block_rdc._0_8_ + 8) == 0) {
          pPVar8 = av1_alloc_pmc(in_stack_ffffffffffffff38,in_stack_ffffffffffffff37,
                                 in_stack_ffffffffffffff28);
          *(PICK_MODE_CONTEXT **)(block_rdc._0_8_ + 8) = pPVar8;
          if (*(long *)(block_rdc._0_8_ + 8) == 0) {
            aom_internal_error(*(aom_internal_error_info **)(in_stack_00000008 + 0x29f0),
                               AOM_CODEC_MEM_ERROR,"Failed to allocate PICK_MODE_CONTEXT");
          }
        }
        else {
          av1_reset_pmc((PICK_MODE_CONTEXT *)0x293e25);
        }
        uVar11 = (undefined2)((ulong)*(undefined8 *)(block_rdc._0_8_ + 8) >> 0x28);
        pick_sb_modes_nonrd(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                            in_stack_fffffffffffffe00,
                            (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
                            (int)in_stack_fffffffffffffdf8,
                            (RD_STATS *)
                            CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                            in_stack_fffffffffffffe20,
                            (PICK_MODE_CONTEXT *)
                            CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        in_stack_fffffffffffffdc8 = *(int *)(lVar5 + (long)y_idx * 0x28) + in_stack_fffffffffffffdc8
        ;
        lVar6 = ((long)in_stack_fffffffffffffdc8 * (long)*(int *)(in_R9 + 0x4218) + 0x100 >> 9) +
                (long)in_stack_fffffffffffffdd0 * 0x80;
        av1_restore_context((MACROBLOCK *)
                            CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                            (RD_SEARCH_MACROBLOCK_CONTEXT *)
                            CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                            in_stack_fffffffffffffd84,in_stack_fffffffffffffd80,
                            (BLOCK_SIZE)((ulong)in_stack_fffffffffffffd78 >> 0x38),
                            (int)in_stack_fffffffffffffd78);
        *(undefined1 *)block_rdc._0_8_ = 3;
        BVar2 = get_partition_subsize((BLOCK_SIZE)((ushort)uVar11 >> 8),(PARTITION_TYPE)uVar11);
        uVar13 = CONCAT13(BVar2,(int3)in_stack_fffffffffffffdc4);
        av1_init_rd_stats((RD_STATS *)&stack0xfffffffffffffdf0);
        in_stack_fffffffffffffdf0 =
             *(int *)(lVar5 + (long)y_idx * 0x28 + 0xc) + in_stack_fffffffffffffdf0;
        if (2 < (byte)(uVar13 >> 0x18)) {
          in_stack_fffffffffffffdf0 =
               *(int *)(lVar5 + (long)y_idx * 0x28) * 4 + in_stack_fffffffffffffdf0;
        }
        for (iVar3 = 0; iVar3 < 4; iVar3 = iVar3 + 1) {
          if (*(long *)(block_rdc._0_8_ + 0xd0 + (long)iVar3 * 8) == 0) {
            pPVar9 = av1_alloc_pc_tree_node((BLOCK_SIZE)((uint)in_stack_fffffffffffffd5c >> 0x18));
            *(PC_TREE **)(block_rdc._0_8_ + 0xd0 + (long)iVar3 * 8) = pPVar9;
            if (*(long *)(block_rdc._0_8_ + 0xd0 + (long)iVar3 * 8) == 0) {
              aom_internal_error(*(aom_internal_error_info **)(in_stack_00000008 + 0x29f0),
                                 AOM_CODEC_MEM_ERROR,"Failed to allocate PC_TREE");
            }
          }
          *(int *)(*(long *)(block_rdc._0_8_ + 0xd0 + (long)iVar3 * 8) + 0xf0) = iVar3;
        }
        for (uVar12 = 0; (int)uVar12 < 4; uVar12 = uVar12 + 1) {
          av1_invalid_rd_stats((RD_STATS *)&stack0xfffffffffffffd90);
          in_stack_fffffffffffffd8c = (uVar12 & 1) * (bVar1 / 2);
          in_stack_fffffffffffffd88 = ((int)uVar12 >> 1) * (bVar1 / 2);
          if (((int)(in_stack_00000018 + in_stack_fffffffffffffd88) <
               *(int *)(in_stack_00000010 + 0xc)) &&
             (in_stack_00000020 + in_stack_fffffffffffffd8c < *(int *)(in_stack_00000010 + 0x10))) {
            *(long *)(in_stack_00000008 + 0x1fc0) =
                 *(long *)(in_RDI[0x8453] + (long)*(int *)(in_RCX + 0x10) * 8) +
                 (long)in_stack_00000020 + (long)in_stack_fffffffffffffd8c;
            *(long *)(in_stack_00000008 + 0x1fc8) =
                 in_stack_00000008 + 0x1fd0 +
                 (long)(int)(in_stack_00000018 + in_stack_fffffffffffffd88 & 0x1f);
            if (*(long *)(*(long *)(block_rdc._0_8_ + 0xd0 + (long)(int)uVar12 * 8) + 8) == 0) {
              pPVar8 = av1_alloc_pmc(in_stack_ffffffffffffff38,in_stack_ffffffffffffff37,
                                     in_stack_ffffffffffffff28);
              *(PICK_MODE_CONTEXT **)(*(long *)(block_rdc._0_8_ + 0xd0 + (long)(int)uVar12 * 8) + 8)
                   = pPVar8;
              if (*(long *)(*(long *)(block_rdc._0_8_ + 0xd0 + (long)(int)uVar12 * 8) + 8) == 0) {
                aom_internal_error(*(aom_internal_error_info **)(in_stack_00000008 + 0x29f0),
                                   AOM_CODEC_MEM_ERROR,"Failed to allocate PICK_MODE_CONTEXT");
              }
            }
            else {
              av1_reset_pmc((PICK_MODE_CONTEXT *)0x2941e4);
            }
            **(undefined1 **)(block_rdc._0_8_ + 0xd0 + (long)(int)uVar12 * 8) = 0;
            uVar10 = uVar13 >> 0x18;
            iVar4 = (int)((ulong)*(undefined8 *)
                                  (*(long *)(block_rdc._0_8_ + 0xd0 + (long)(int)uVar12 * 8) + 8) >>
                         0x20);
            pick_sb_modes_nonrd(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                                in_stack_fffffffffffffe00,
                                (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
                                (int)in_stack_fffffffffffffdf8,
                                (RD_STATS *)
                                CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                                in_stack_fffffffffffffe20,
                                (PICK_MODE_CONTEXT *)
                                CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
            in_stack_fffffffffffffdf0 = in_stack_fffffffffffffd90 + in_stack_fffffffffffffdf0;
            in_stack_fffffffffffffdf8 =
                 (PICK_MODE_CONTEXT *)
                 ((long)(in_stack_fffffffffffffdf8->mic).mv +
                 CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98) + -8);
            av1_rd_cost_update(iVar4,(RD_STATS *)CONCAT44(in_stack_fffffffffffffd5c,uVar10));
            if (lVar6 < (long)in_stack_fffffffffffffe00) break;
            if (uVar12 != 3) {
              in_stack_fffffffffffffd78 = 0;
              encode_b_nonrd(in_stack_fffffffffffffdd0,
                             (TileDataEnc *)
                             CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                             (ThreadData *)CONCAT44(uVar13,iVar3),
                             (TokenExtra **)CONCAT44(uVar12,in_stack_fffffffffffffdb8),
                             in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0,
                             (RUN_TYPE)in_stack_fffffffffffffde0,in_stack_fffffffffffffde8,
                             (PARTITION_TYPE)in_stack_fffffffffffffdf0,in_stack_fffffffffffffdf8,
                             (int *)in_stack_fffffffffffffe00);
            }
          }
        }
        av1_restore_context((MACROBLOCK *)
                            CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                            (RD_SEARCH_MACROBLOCK_CONTEXT *)
                            CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                            in_stack_fffffffffffffd84,in_stack_fffffffffffffd80,
                            (BLOCK_SIZE)((ulong)in_stack_fffffffffffffd78 >> 0x38),
                            (int)in_stack_fffffffffffffd78);
        local_4 = (uint)(((long)in_stack_fffffffffffffdf0 * (long)*(int *)(in_R9 + 0x4218) + 0x100
                         >> 9) + (long)in_stack_fffffffffffffdf8 * 0x80 < lVar6);
      }
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int try_split_partition(AV1_COMP *const cpi, ThreadData *const td,
                               TileDataEnc *const tile_data,
                               TileInfo *const tile_info, TokenExtra **tp,
                               MACROBLOCK *const x, MACROBLOCKD *const xd,
                               const CommonModeInfoParams *const mi_params,
                               const int mi_row, const int mi_col,
                               const BLOCK_SIZE bsize, const int pl,
                               PC_TREE *pc_tree) {
  AV1_COMMON *const cm = &cpi->common;
  const ModeCosts *mode_costs = &x->mode_costs;
  const int hbs = mi_size_wide[bsize] / 2;
  if (mi_row + mi_size_high[bsize] >= mi_params->mi_rows ||
      mi_col + mi_size_wide[bsize] >= mi_params->mi_cols)
    return 0;
  if (bsize <= BLOCK_8X8 || frame_is_intra_only(cm)) return 0;
  if (x->content_state_sb.source_sad_nonrd <= kLowSad) return 0;

  // Do not try split partition when the source sad is small, or
  // the prediction residual is small.
  const YV12_BUFFER_CONFIG *const yv12 = get_ref_frame_yv12_buf(cm, LAST_FRAME);
  const struct scale_factors *const sf =
      get_ref_scale_factors_const(cm, LAST_FRAME);
  const int num_planes = av1_num_planes(cm);
  av1_setup_src_planes(x, cpi->source, mi_row, mi_col, num_planes, bsize);
  av1_setup_pre_planes(xd, 0, yv12, mi_row, mi_col, sf, num_planes);
  int block_sad = 0;
  for (int plane = 0; plane < num_planes; ++plane) {
    const struct macroblock_plane *const p = &x->plane[plane];
    const struct macroblockd_plane *const pd = &xd->plane[plane];
    const BLOCK_SIZE bs =
        get_plane_block_size(bsize, pd->subsampling_x, pd->subsampling_y);
    const unsigned int plane_sad = cpi->ppi->fn_ptr[bs].sdf(
        p->src.buf, p->src.stride, pd->pre[0].buf, pd->pre[0].stride);
    block_sad += plane_sad;
  }
  const int blk_pix = block_size_wide[bsize] * block_size_high[bsize];
  const int block_avg_sad = block_sad / blk_pix;
  // TODO(chengchen): find a proper threshold. It might change according to
  // q as well.
  const int threshold = 25;
  if (block_avg_sad < threshold) return 0;

  RD_SEARCH_MACROBLOCK_CONTEXT x_ctx;
  RD_STATS split_rdc, none_rdc;
  av1_invalid_rd_stats(&split_rdc);
  av1_invalid_rd_stats(&none_rdc);
  av1_save_context(x, &x_ctx, mi_row, mi_col, bsize, 3);
  xd->above_txfm_context =
      cm->above_contexts.txfm[tile_info->tile_row] + mi_col;
  xd->left_txfm_context =
      xd->left_txfm_context_buffer + (mi_row & MAX_MIB_MASK);

  // Calculate rdcost for none partition
  pc_tree->partitioning = PARTITION_NONE;
  av1_set_offsets(cpi, tile_info, x, mi_row, mi_col, bsize);
  if (!pc_tree->none) {
    pc_tree->none = av1_alloc_pmc(cpi, bsize, &td->shared_coeff_buf);
    if (!pc_tree->none)
      aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PICK_MODE_CONTEXT");
  } else {
    av1_reset_pmc(pc_tree->none);
  }
  pick_sb_modes_nonrd(cpi, tile_data, x, mi_row, mi_col, &none_rdc, bsize,
                      pc_tree->none);
  none_rdc.rate += mode_costs->partition_cost[pl][PARTITION_NONE];
  none_rdc.rdcost = RDCOST(x->rdmult, none_rdc.rate, none_rdc.dist);
  av1_restore_context(x, &x_ctx, mi_row, mi_col, bsize, 3);

  // Calculate rdcost for split partition
  pc_tree->partitioning = PARTITION_SPLIT;
  const BLOCK_SIZE subsize = get_partition_subsize(bsize, PARTITION_SPLIT);
  av1_init_rd_stats(&split_rdc);
  split_rdc.rate += mode_costs->partition_cost[pl][PARTITION_SPLIT];
  if (subsize >= BLOCK_8X8) {
    split_rdc.rate += (mode_costs->partition_cost[pl][PARTITION_NONE] * 4);
  }
  for (int i = 0; i < SUB_PARTITIONS_SPLIT; ++i) {
    if (!pc_tree->split[i]) {
      pc_tree->split[i] = av1_alloc_pc_tree_node(subsize);
      if (!pc_tree->split[i])
        aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                           "Failed to allocate PC_TREE");
    }
    pc_tree->split[i]->index = i;
  }
  for (int i = 0; i < SUB_PARTITIONS_SPLIT; i++) {
    RD_STATS block_rdc;
    av1_invalid_rd_stats(&block_rdc);
    int x_idx = (i & 1) * hbs;
    int y_idx = (i >> 1) * hbs;
    if ((mi_row + y_idx >= mi_params->mi_rows) ||
        (mi_col + x_idx >= mi_params->mi_cols))
      continue;
    xd->above_txfm_context =
        cm->above_contexts.txfm[tile_info->tile_row] + mi_col + x_idx;
    xd->left_txfm_context =
        xd->left_txfm_context_buffer + ((mi_row + y_idx) & MAX_MIB_MASK);
    if (!pc_tree->split[i]->none) {
      pc_tree->split[i]->none =
          av1_alloc_pmc(cpi, subsize, &td->shared_coeff_buf);
      if (!pc_tree->split[i]->none)
        aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                           "Failed to allocate PICK_MODE_CONTEXT");
    } else {
      av1_reset_pmc(pc_tree->split[i]->none);
    }
    pc_tree->split[i]->partitioning = PARTITION_NONE;
    pick_sb_modes_nonrd(cpi, tile_data, x, mi_row + y_idx, mi_col + x_idx,
                        &block_rdc, subsize, pc_tree->split[i]->none);
    split_rdc.rate += block_rdc.rate;
    split_rdc.dist += block_rdc.dist;
    av1_rd_cost_update(x->rdmult, &split_rdc);
    if (none_rdc.rdcost < split_rdc.rdcost) break;
    if (i != SUB_PARTITIONS_SPLIT - 1)
      encode_b_nonrd(cpi, tile_data, td, tp, mi_row + y_idx, mi_col + x_idx, 1,
                     subsize, PARTITION_NONE, pc_tree->split[i]->none, NULL);
  }
  av1_restore_context(x, &x_ctx, mi_row, mi_col, bsize, 3);
  split_rdc.rdcost = RDCOST(x->rdmult, split_rdc.rate, split_rdc.dist);
  const int split = split_rdc.rdcost < none_rdc.rdcost;

  return split;
}